

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O2

void __thiscall
Reset_testValueSetClear_Test::~Reset_testValueSetClear_Test(Reset_testValueSetClear_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, testValueSetClear)
{
    const std::string test1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <reset variable=\"A\" test_variable=\"B\" order=\"1\"/>\n"
        "  </component>\n"
        "</model>\n";

    const std::string test2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <reset variable=\"A\" test_variable=\"B\" order=\"1\">\n"
        "      <test_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\"/>\n"
        "      </test_value>\n"
        "    </reset>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::ResetPtr r = libcellml::Reset::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::PrinterPtr p = libcellml::Printer::create();

    v1->setName("A");
    v2->setName("B");

    r->setVariable(v1);
    r->setTestVariable(v2);
    r->setOrder(1);
    c->addReset(r);

    const std::string out1 = p->printModel(m);
    EXPECT_EQ(test1, out1);

    // Test setting of test_value block.
    r->setTestValue(EMPTY_MATH);
    const std::string out2 = p->printModel(m);
    EXPECT_EQ(test2, out2);

    // Test clearing of test_value block.
    r->removeTestValue();
    const std::string out3 = p->printModel(m);
    EXPECT_EQ(test1, out3);
}